

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::AV1CompMaskPredTest_DISABLED_Speed_Test>::CreateTest
          (ParameterizedTestFactory<(anonymous_namespace)::AV1CompMaskPredTest_DISABLED_Speed_Test>
           *this)

{
  Test *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int,unsigned_char_const*,int,int),BLOCK_SIZE>>
  ::parameter_ = &this->parameter_;
  this_00 = (Test *)operator_new(0x48);
  Test::Test(this_00);
  *(undefined4 *)&this_00[1]._vptr_Test = 0xbaba;
  this_00->_vptr_Test = (_func_int **)&PTR__AV1CompMaskPredTest_010a0710;
  this_00[4]._vptr_Test = (_func_int **)&PTR__AV1CompMaskPredTest_DISABLED_Speed_Test_010a0750;
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }